

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

CURLcode Curl_sasl_decode_digest_http_message(char *chlg,digestdata *digest)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  byte *pbVar4;
  byte bVar5;
  ulong uVar6;
  char *tok_buf;
  char value [256];
  char content [1024];
  byte *local_568;
  ulong local_560;
  ulong local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char local_538 [256];
  char local_438 [1032];
  
  local_548 = digest->nonce;
  local_568 = (byte *)chlg;
  Curl_sasl_digest_cleanup(digest);
  local_560 = 0;
  local_558 = 0;
  do {
    bVar5 = *chlg;
    if (bVar5 != 0) {
      ppuVar2 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar2 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) break;
        bVar5 = ((byte *)chlg)[1];
        chlg = (char *)((byte *)chlg + 1);
      } while (bVar5 != 0);
    }
    local_568 = (byte *)chlg;
    iVar1 = Curl_sasl_digest_get_pair(chlg,local_538,local_438,(char **)&local_568);
    if (iVar1 != 0) {
      if ((local_548 != (char *)0x0) && (digest->stale != true)) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if (digest->nonce != (char *)0x0) {
        return CURLE_OK;
      }
      return CURLE_BAD_CONTENT_ENCODING;
    }
    iVar1 = Curl_raw_equal(local_538,"nonce");
    if (iVar1 != 0) {
      pcVar3 = (*Curl_cstrdup)(local_438);
      digest->nonce = pcVar3;
      goto LAB_004a08cd;
    }
    iVar1 = Curl_raw_equal(local_538,"stale");
    if (iVar1 != 0) {
      iVar1 = Curl_raw_equal(local_438,"true");
      if (iVar1 != 0) {
        digest->stale = true;
        digest->nc = 1;
      }
      goto LAB_004a08d6;
    }
    iVar1 = Curl_raw_equal(local_538,"realm");
    if (iVar1 == 0) {
      iVar1 = Curl_raw_equal(local_538,"opaque");
      if (iVar1 != 0) {
        pcVar3 = (*Curl_cstrdup)(local_438);
        digest->opaque = pcVar3;
        goto LAB_004a08cd;
      }
      iVar1 = Curl_raw_equal(local_538,"qop");
      if (iVar1 != 0) {
        local_550 = (*Curl_cstrdup)(local_438);
        if (local_550 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar3 = strtok_r(local_550,",",&local_540);
        uVar6 = local_560;
        while (pcVar3 != (char *)0x0) {
          iVar1 = Curl_raw_equal(pcVar3,"auth");
          if (iVar1 == 0) {
            iVar1 = Curl_raw_equal(pcVar3,"auth-int");
            local_558 = CONCAT71((int7)(local_558 >> 8),(byte)local_558 | iVar1 != 0);
          }
          else {
            uVar6 = CONCAT71((int7)(uVar6 >> 8),1);
          }
          pcVar3 = strtok_r((char *)0x0,",",&local_540);
        }
        (*Curl_cfree)(local_550);
        local_560 = uVar6;
        if ((uVar6 & 1) == 0) {
          if ((local_558 & 1) == 0) goto LAB_004a08d6;
          pcVar3 = "auth-int";
        }
        else {
          pcVar3 = "auth";
        }
        pcVar3 = (*Curl_cstrdup)(pcVar3);
        digest->qop = pcVar3;
        goto LAB_004a08cd;
      }
      iVar1 = Curl_raw_equal(local_538,"algorithm");
      if (iVar1 != 0) {
        pcVar3 = (*Curl_cstrdup)(local_438);
        digest->algorithm = pcVar3;
        if (pcVar3 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        iVar1 = Curl_raw_equal(local_438,"MD5-sess");
        if (iVar1 == 0) {
          iVar1 = Curl_raw_equal(local_438,"MD5");
          if (iVar1 == 0) {
            return CURLE_BAD_CONTENT_ENCODING;
          }
          digest->algo = 0;
        }
        else {
          digest->algo = 1;
        }
      }
    }
    else {
      pcVar3 = (*Curl_cstrdup)(local_438);
      digest->realm = pcVar3;
LAB_004a08cd:
      if (pcVar3 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
LAB_004a08d6:
    chlg = (char *)local_568;
    bVar5 = *local_568;
    if (bVar5 != 0) {
      ppuVar2 = __ctype_b_loc();
      do {
        pbVar4 = (byte *)chlg + 1;
        if ((*(byte *)((long)*ppuVar2 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) {
          local_568 = (byte *)chlg;
          if (bVar5 == 0x2c) {
            chlg = (char *)pbVar4;
            local_568 = pbVar4;
          }
          break;
        }
        bVar5 = *pbVar4;
        chlg = (char *)pbVar4;
        local_568 = pbVar4;
      } while (bVar5 != 0);
    }
  } while( true );
}

Assistant:

CURLcode Curl_sasl_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  char *token = NULL;
  char *tmp = NULL;

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_sasl_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(!Curl_sasl_digest_get_pair(chlg, value, content, &chlg)) {
      if(Curl_raw_equal(value, "nonce")) {
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(Curl_raw_equal(value, "stale")) {
        if(Curl_raw_equal(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(Curl_raw_equal(value, "realm")) {
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(Curl_raw_equal(value, "opaque")) {
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(Curl_raw_equal(value, "qop")) {
        char *tok_buf;
        /* Tokenize the list and choose auth if possible, use a temporary
            clone of the buffer since strtok_r() ruins it */
        tmp = strdup(content);
        if(!tmp)
          return CURLE_OUT_OF_MEMORY;

        token = strtok_r(tmp, ",", &tok_buf);
        while(token != NULL) {
          if(Curl_raw_equal(token, DIGEST_QOP_VALUE_STRING_AUTH)) {
            foundAuth = TRUE;
          }
          else if(Curl_raw_equal(token, DIGEST_QOP_VALUE_STRING_AUTH_INT)) {
            foundAuthInt = TRUE;
          }
          token = strtok_r(NULL, ",", &tok_buf);
        }

        free(tmp);

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(Curl_raw_equal(value, "algorithm")) {
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(Curl_raw_equal(content, "MD5-sess"))
          digest->algo = CURLDIGESTALGO_MD5SESS;
        else if(Curl_raw_equal(content, "MD5"))
          digest->algo = CURLDIGESTALGO_MD5;
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else {
        /* unknown specifier, ignore it! */
      }
    }
    else
      break; /* we're done here */

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that's a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}